

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  uint64_t uVar1;
  uint64_t seed;
  long lVar2;
  StrHash h;
  int iVar3;
  GCstr *pGVar4;
  MSize len;
  GCstr *pGVar5;
  uint uVar6;
  bool bVar7;
  uint local_44;
  
  uVar1 = (L->glref).ptr64;
  if (0x7ffffefe < lenx - 1) {
    if (lenx == 0) {
      return (GCstr *)(uVar1 + 0x78);
    }
    lj_err_msg(L,LJ_ERR_STROV);
  }
  seed = *(uint64_t *)(uVar1 + 0xb0);
  len = (MSize)lenx;
  h = hash_sparse(seed,str,len);
  lVar2 = *(long *)(uVar1 + 0x98);
  uVar6 = *(uint *)(uVar1 + 0xa0);
  pGVar4 = *(GCstr **)(lVar2 + (ulong)(h & uVar6) * 8);
  bVar7 = ((ulong)pGVar4 & 1) != 0;
  pGVar5 = pGVar4;
  if (bVar7) {
    h = hash_dense(seed,h,str,len);
    pGVar5 = (GCstr *)(*(ulong *)(lVar2 + (ulong)(uVar6 & h) * 8) & 0xfffffffffffffffe);
  }
  local_44 = (uint)bVar7;
  if (pGVar5 != (GCstr *)0x0) {
    uVar6 = 0;
    do {
      if ((pGVar5->hash == h) && (pGVar5->len == len)) {
        iVar3 = bcmp(str,pGVar5 + 1,lenx);
        if (iVar3 == 0) {
          if ((~*(byte *)(uVar1 + 0x20) & pGVar5->marked & 3) == 0) {
            return pGVar5;
          }
          pGVar5->marked = pGVar5->marked ^ 3;
          return pGVar5;
        }
        uVar6 = uVar6 + 1;
      }
      uVar6 = uVar6 + 1;
      pGVar5 = (GCstr *)(pGVar5->nextgc).gcptr64;
    } while (pGVar5 != (GCstr *)0x0);
    if (0x20 < uVar6) {
      if (((ulong)pGVar4 & 1) == 0) {
        pGVar4 = lj_str_rehash_chain(L,h,str,len);
        return pGVar4;
      }
      local_44 = 1;
    }
  }
  pGVar4 = lj_str_alloc(L,str,len,h,local_44);
  return pGVar4;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}